

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

void mbedtls_rsa_init(mbedtls_rsa_context *ctx,int padding,int hash_id)

{
  int hash_id_local;
  int padding_local;
  mbedtls_rsa_context *ctx_local;
  
  memset(ctx,0,0x150);
  mbedtls_rsa_set_padding(ctx,padding,hash_id);
  return;
}

Assistant:

void mbedtls_rsa_init( mbedtls_rsa_context *ctx,
               int padding,
               int hash_id )
{
    RSA_VALIDATE( ctx != NULL );
    RSA_VALIDATE( padding == MBEDTLS_RSA_PKCS_V15 ||
                  padding == MBEDTLS_RSA_PKCS_V21 );

    memset( ctx, 0, sizeof( mbedtls_rsa_context ) );

    mbedtls_rsa_set_padding( ctx, padding, hash_id );

#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_init( &ctx->mutex );
#endif
}